

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O2

int ON_Get3dConvexHull(ON_SimpleArray<ON_3dPoint> *points,ON_SimpleArray<ON_PlaneEquation> *hull)

{
  ON_3dPoint *pOVar1;
  ON_SimpleArray<ON_PlaneEquation> *this;
  bool bVar2;
  int iVar3;
  double *pdVar4;
  ON_PlaneEquation *pOVar5;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  uint local_1ac;
  ON_PlaneEquation local_1a8;
  ON_SimpleArray<ON_PlaneEquation> *local_180;
  double local_178;
  undefined8 uStack_170;
  long local_168;
  uint local_15c;
  double local_158;
  undefined8 uStack_150;
  long local_140;
  double local_138;
  undefined8 uStack_130;
  size_t local_120;
  ulong local_118;
  long local_110;
  double local_108;
  undefined8 uStack_100;
  double local_f8;
  undefined8 uStack_f0;
  double local_e8;
  undefined8 uStack_e0;
  double local_d8;
  double dStack_d0;
  double local_c8;
  double dStack_c0;
  double local_b8;
  double dStack_b0;
  double local_a8;
  undefined8 uStack_a0;
  double local_98;
  undefined8 uStack_90;
  double local_88;
  undefined8 uStack_80;
  ON_3dVector local_78;
  ON_3dVector local_60;
  ON_3dVector local_48;
  
  iVar7 = points->m_count;
  uVar8 = (ulong)iVar7;
  iVar3 = 0;
  if (2 < (long)uVar8) {
    local_168 = (long)hull->m_count;
    local_120 = local_168 + 4;
    local_180 = hull;
    ON_SimpleArray<ON_PlaneEquation>::Reserve(hull,local_120);
    ON_PlaneEquation::ON_PlaneEquation(&local_1a8);
    local_140 = 1;
    local_118 = 0;
    local_1ac = 2;
    while (local_118 != uVar8) {
      pOVar1 = points->m_a;
      local_e8 = pOVar1[local_118].x;
      uStack_e0 = 0;
      local_f8 = pOVar1[local_118].y;
      uStack_f0 = 0;
      local_108 = pOVar1[local_118].z;
      uStack_100 = 0;
      local_118 = local_118 + 1;
      local_110 = local_140;
      local_15c = local_1ac;
      while ((int)local_110 < iVar7) {
        pOVar1 = points->m_a;
        local_b8 = pOVar1[local_110].x;
        local_c8 = pOVar1[local_110].y;
        local_d8 = pOVar1[local_110].z;
        local_110 = local_110 + 1;
        local_88 = local_b8 - local_e8;
        uStack_80 = 0;
        local_98 = local_c8 - local_f8;
        uStack_90 = 0;
        local_a8 = local_d8 - local_108;
        uStack_a0 = 0;
        dStack_d0 = local_108;
        dStack_b0 = local_e8;
        dStack_c0 = local_f8;
        for (uVar9 = (ulong)local_15c; (int)uVar9 < iVar7; uVar9 = uVar9 + 1) {
          pOVar1 = points->m_a;
          local_158 = pOVar1[uVar9].x;
          local_138 = pOVar1[uVar9].y;
          local_178 = pOVar1[uVar9].z;
          ON_3dVector::ON_3dVector(&local_48,local_88,local_98,local_a8);
          ON_3dVector::ON_3dVector
                    (&local_60,local_158 - local_e8,local_138 - local_f8,local_178 - local_108);
          ON_CrossProduct(&local_78,&local_48,&local_60);
          local_1a8.z = local_78.z;
          local_1a8.x = local_78.x;
          local_1a8.y = local_78.y;
          bVar2 = ON_3dVector::Unitize((ON_3dVector *)&local_1a8);
          this = local_180;
          if (bVar2) {
            dVar11 = local_1a8.z * dStack_d0 + local_1a8.x * dStack_b0 + local_1a8.y * dStack_c0;
            local_1a8.d = -dVar11;
            dVar13 = dVar11 - dVar11;
            dVar10 = (local_1a8.z * local_d8 + local_1a8.x * local_b8 + local_1a8.y * local_c8) -
                     dVar11;
            dVar15 = dVar10;
            if ((dVar10 < dVar13) || (dVar15 = dVar13, dVar10 <= dVar13)) {
              dVar10 = dVar13;
              dVar13 = dVar15;
            }
            dVar14 = (local_178 * local_1a8.z + local_158 * local_1a8.x + local_138 * local_1a8.y) -
                     dVar11;
            dVar15 = dVar14;
            if ((dVar14 < dVar13) || (dVar15 = dVar13, dVar14 <= dVar10)) {
              dVar13 = dVar15;
              dVar14 = dVar10;
            }
            dVar10 = -2.3283064365386963e-10;
            if (dVar13 <= -2.3283064365386963e-10) {
              dVar10 = dVar13;
            }
            dVar13 = 2.3283064365386963e-10;
            if (2.3283064365386963e-10 <= dVar14) {
              dVar13 = dVar14;
            }
            pdVar4 = &points->m_a->z;
            bVar2 = true;
            dVar15 = 0.0;
            uVar6 = 0;
            dVar14 = 0.0;
            while ((uVar6 < uVar8 && (bVar2))) {
              dVar12 = (*pdVar4 * local_1a8.z +
                       ((ON_3dPoint *)(pdVar4 + -2))->x * local_1a8.x + pdVar4[-1] * local_1a8.y) -
                       dVar11;
              if (dVar15 <= dVar12) {
                bVar2 = true;
                if (dVar14 < dVar12) {
                  bVar2 = dVar12 <= dVar13 || dVar10 <= dVar15;
                  dVar14 = dVar12;
                }
              }
              else {
                bVar2 = dVar10 <= dVar12 || dVar14 <= dVar13;
                dVar15 = dVar12;
              }
              uVar6 = uVar6 + 1;
              pdVar4 = pdVar4 + 3;
            }
            if (bVar2) {
              if (dVar14 <= dVar13) {
                uStack_150 = 0;
                local_158 = dVar14;
                if (dVar10 <= dVar15) {
                  uStack_170 = 0;
                  uStack_130 = 0;
                  iVar3 = (int)local_168;
                  if ((-1 < iVar3) && (iVar3 <= local_180->m_capacity)) {
                    local_180->m_count = iVar3;
                  }
                  local_178 = dVar15;
                  local_138 = dVar10;
                  pOVar5 = ON_SimpleArray<ON_PlaneEquation>::AppendNew(local_180);
                  *(undefined4 *)&pOVar5->x = local_1a8.x._0_4_;
                  *(uint *)((long)&pOVar5->x + 4) = local_1a8.x._4_4_ ^ 0x80000000;
                  *(int *)&pOVar5->y = SUB84(local_1a8.y,0);
                  *(uint *)((long)&pOVar5->y + 4) = (uint)((ulong)local_1a8.y >> 0x20) ^ 0x80000000;
                  *(undefined4 *)&pOVar5->z = local_1a8.z._0_4_;
                  *(uint *)((long)&pOVar5->z + 4) = local_1a8.z._4_4_ ^ 0x80000000;
                  *(int *)&pOVar5->d = SUB84(local_1a8.d - local_178,0);
                  *(uint *)((long)&pOVar5->d + 4) =
                       (uint)((ulong)(local_1a8.d - local_178) >> 0x20) ^ 0x80000000;
                  pOVar5 = ON_SimpleArray<ON_PlaneEquation>::AppendNew(this);
                  pOVar5->x = local_1a8.x;
                  pOVar5->y = local_1a8.y;
                  pOVar5->z = local_1a8.z;
                  pOVar5->d = local_1a8.d - local_158;
                  if (local_138 <= local_178) {
                    return 2;
                  }
                }
                else {
                  pOVar5 = ON_SimpleArray<ON_PlaneEquation>::AppendNew(local_180);
                  pOVar5->x = local_1a8.x;
                  pOVar5->y = local_1a8.y;
                  pOVar5->z = local_1a8.z;
                  pOVar5->d = local_1a8.d - local_158;
                }
              }
              else if (dVar10 <= dVar15) {
                uStack_170 = 0;
                local_178 = dVar15;
                pOVar5 = ON_SimpleArray<ON_PlaneEquation>::AppendNew(local_180);
                *(undefined4 *)&pOVar5->x = local_1a8.x._0_4_;
                *(uint *)((long)&pOVar5->x + 4) = local_1a8.x._4_4_ ^ 0x80000000;
                *(int *)&pOVar5->y = SUB84(local_1a8.y,0);
                *(uint *)((long)&pOVar5->y + 4) = (uint)((ulong)local_1a8.y >> 0x20) ^ 0x80000000;
                *(undefined4 *)&pOVar5->z = local_1a8.z._0_4_;
                *(uint *)((long)&pOVar5->z + 4) = local_1a8.z._4_4_ ^ 0x80000000;
                *(int *)&pOVar5->d = SUB84(local_1a8.d - local_178,0);
                *(uint *)((long)&pOVar5->d + 4) =
                     (uint)((ulong)(local_1a8.d - local_178) >> 0x20) ^ 0x80000000;
              }
            }
          }
        }
        local_15c = local_15c + 1;
      }
      local_1ac = local_1ac + 1;
      local_140 = local_140 + 1;
    }
    iVar3 = local_180->m_count;
    iVar7 = (int)local_168;
    if (((iVar3 < (int)local_120) && (-1 < iVar7)) && (iVar7 <= local_180->m_capacity)) {
      local_180->m_count = iVar7;
      iVar3 = iVar7;
    }
    iVar3 = iVar3 - iVar7;
  }
  return iVar3;
}

Assistant:

bool ON_2fVector::IsUnset() const
{
  return Internal_IsUnsetFloat(2, &x);
}